

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

int get_bool_option(JSContext *ctx,BOOL *pbool,JSValue obj,char *option)

{
  int iVar1;
  int iVar2;
  JSRefCountHeader *p;
  uint uVar3;
  JSValue val;
  
  val = JS_GetPropertyStr(ctx,obj,option);
  uVar3 = (uint)val.tag;
  if (uVar3 == 6) {
    iVar2 = -1;
  }
  else if (uVar3 == 3) {
    iVar2 = 0;
  }
  else {
    iVar2 = JS_ToBool(ctx,val);
    *pbool = iVar2;
    iVar2 = 0;
    if ((0xfffffff4 < uVar3) && (iVar1 = *val.u.ptr, *(int *)val.u.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValue(ctx,val);
    }
  }
  return iVar2;
}

Assistant:

static int get_bool_option(JSContext *ctx, BOOL *pbool,
                           JSValueConst obj,
                           const char *option)
{
    JSValue val;
    val = JS_GetPropertyStr(ctx, obj, option);
    if (JS_IsException(val))
        return -1;
    if (!JS_IsUndefined(val)) {
        *pbool = JS_ToBool(ctx, val);
    }
    JS_FreeValue(ctx, val);
    return 0;
}